

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes_main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  string output_path;
  string input_path;
  Webm2Pes converter;
  
  if (argc < 3) {
    printf("Usage: %s <WebM file> <output file>",*argv);
    uVar2 = 1;
  }
  else {
    std::__cxx11::string::string((string *)&input_path,argv[1],(allocator *)&converter);
    std::__cxx11::string::string((string *)&output_path,argv[2],(allocator *)&converter);
    libwebm::Webm2Pes::Webm2Pes(&converter,&input_path,&output_path);
    bVar1 = libwebm::Webm2Pes::ConvertToFile(&converter);
    uVar2 = (uint)!bVar1;
    libwebm::Webm2Pes::~Webm2Pes(&converter);
    std::__cxx11::string::~string((string *)&output_path);
    std::__cxx11::string::~string((string *)&input_path);
  }
  return uVar2;
}

Assistant:

int main(int argc, const char* argv[]) {
  if (argc < 3) {
    Usage(argv);
    return EXIT_FAILURE;
  }

  const std::string input_path = argv[1];
  const std::string output_path = argv[2];

  libwebm::Webm2Pes converter(input_path, output_path);
  return converter.ConvertToFile() == true ? EXIT_SUCCESS : EXIT_FAILURE;
}